

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanFlowStart(Scanner *this)

{
  Stream *in_RDI;
  Mark MVar1;
  Scanner *in_stack_00000030;
  TYPE type;
  FLOW_MARKER flowType;
  char ch;
  Mark mark;
  Stream *in_stack_ffffffffffffff50;
  Stream *this_00;
  Token *in_stack_ffffffffffffff60;
  undefined1 local_90 [92];
  uint local_34;
  uint local_30;
  char local_29;
  Mark local_28;
  undefined8 local_18;
  int local_10;
  
  InsertPotentialSimpleKey(in_stack_00000030);
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = 1;
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 0;
  MVar1 = YAML::Stream::mark(in_RDI);
  local_28.column = MVar1.column;
  local_10 = local_28.column;
  local_28._0_8_ = MVar1._0_8_;
  local_18._0_4_ = local_28.pos;
  local_18._4_4_ = local_28.line;
  local_28 = MVar1;
  local_29 = YAML::Stream::get(in_stack_ffffffffffffff50);
  local_30 = (uint)(local_29 == '[');
  std::
  stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
  ::push((stack<YAML::Scanner::FLOW_MARKER,_std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>_>
          *)in_stack_ffffffffffffff50,(value_type *)in_RDI);
  local_34 = local_30 == 1 ^ 9;
  this_00 = in_RDI + 1;
  Token::Token(in_stack_ffffffffffffff60,(TYPE)((ulong)local_90 >> 0x20),(Mark *)this_00);
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)this_00,
             (value_type *)in_RDI);
  Token::~Token((Token *)this_00);
  return;
}

Assistant:

void Scanner::ScanFlowStart() {
  // flows can be simple keys
  InsertPotentialSimpleKey();
  m_simpleKeyAllowed = true;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  char ch = INPUT.get();
  FLOW_MARKER flowType = (ch == Keys::FlowSeqStart ? FLOW_SEQ : FLOW_MAP);
  m_flows.push(flowType);
  Token::TYPE type =
      (flowType == FLOW_SEQ ? Token::FLOW_SEQ_START : Token::FLOW_MAP_START);
  m_tokens.push(Token(type, mark));
}